

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clear(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  int **p;
  int **p_00;
  int **p_01;
  int **p_02;
  int **p_03;
  pointer pnVar1;
  int *piVar2;
  int32_t iVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar4;
  long lVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  cpp_dec_float<200u,int,void> *pcVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  byte bVar9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  bVar9 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).rowMemMult.m_backend,5);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).colMemMult.m_backend,5);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).lMemMult.m_backend,1);
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.firstUpdate = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.firstUnused = 0;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thedim = 0;
  this->usetup = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).maxabs.m_backend,1);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).initMaxabs.m_backend,1);
  pnVar6 = &this->minThreshold;
  pnVar8 = &this->lastThreshold;
  for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)(pnVar8->m_backend).data._M_elems =
         *(undefined8 *)(pnVar6->m_backend).data._M_elems;
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + (ulong)bVar9 * -0x10 + 8);
    pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  (this->lastThreshold).m_backend.exp = (this->minThreshold).m_backend.exp;
  (this->lastThreshold).m_backend.neg = (this->minThreshold).m_backend.neg;
  iVar3 = (this->minThreshold).m_backend.prec_elem;
  (this->lastThreshold).m_backend.fpclass = (this->minThreshold).m_backend.fpclass;
  (this->lastThreshold).m_backend.prec_elem = iVar3;
  local_40 = 0x1c00000000;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4b = 0;
  iStack_48 = 0;
  bStack_44 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_b8,0.04);
  pcVar7 = (cpp_dec_float<200u,int,void> *)&local_b8;
  pnVar6 = &this->minStability;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = *(uint *)pcVar7;
    pcVar7 = pcVar7 + (ulong)bVar9 * -8 + 4;
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + (ulong)bVar9 * -8 + 4);
  }
  (this->minStability).m_backend.exp = iStack_48;
  (this->minStability).m_backend.neg = bStack_44;
  (this->minStability).m_backend.fpclass = (undefined4)local_40;
  (this->minStability).m_backend.prec_elem = local_40._4_4_;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).stat = UNLOADED;
  pnVar1 = (this->vec).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar4 = (this->vec).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pnVar4 != pnVar1; pnVar4 = pnVar4 + 1) {
    (pnVar4->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar4->m_backend).prec_elem = 0x1c;
    (pnVar4->m_backend).data._M_elems[0] = 0;
    (pnVar4->m_backend).data._M_elems[1] = 0;
    (pnVar4->m_backend).data._M_elems[2] = 0;
    (pnVar4->m_backend).data._M_elems[3] = 0;
    (pnVar4->m_backend).data._M_elems[4] = 0;
    (pnVar4->m_backend).data._M_elems[5] = 0;
    (pnVar4->m_backend).data._M_elems[6] = 0;
    (pnVar4->m_backend).data._M_elems[7] = 0;
    (pnVar4->m_backend).data._M_elems[8] = 0;
    (pnVar4->m_backend).data._M_elems[9] = 0;
    (pnVar4->m_backend).data._M_elems[10] = 0;
    (pnVar4->m_backend).data._M_elems[0xb] = 0;
    (pnVar4->m_backend).data._M_elems[0xc] = 0;
    (pnVar4->m_backend).data._M_elems[0xd] = 0;
    (pnVar4->m_backend).data._M_elems[0xe] = 0;
    (pnVar4->m_backend).data._M_elems[0xf] = 0;
    (pnVar4->m_backend).data._M_elems[0x10] = 0;
    (pnVar4->m_backend).data._M_elems[0x11] = 0;
    (pnVar4->m_backend).data._M_elems[0x12] = 0;
    (pnVar4->m_backend).data._M_elems[0x13] = 0;
    (pnVar4->m_backend).data._M_elems[0x14] = 0;
    (pnVar4->m_backend).data._M_elems[0x15] = 0;
    (pnVar4->m_backend).data._M_elems[0x16] = 0;
    (pnVar4->m_backend).data._M_elems[0x17] = 0;
    (pnVar4->m_backend).data._M_elems[0x18] = 0;
    (pnVar4->m_backend).data._M_elems[0x19] = 0;
    (pnVar4->m_backend).data._M_elems[0x1a] = 0;
    (pnVar4->m_backend).data._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + 0x6d) = 0;
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&this->eta);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&this->ssvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&this->forest);
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.row.size = 100;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).u.col.size = 100;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.size = 100;
  (this->
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).l.startSize = 100;
  piVar2 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).l.ridx;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).l.ridx = (int *)0x0;
  }
  piVar2 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).l.rbeg;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).l.rbeg = (int *)0x0;
  }
  piVar2 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).l.rorig;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).l.rorig = (int *)0x0;
  }
  piVar2 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).l.rperm;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (this->
    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).l.rperm = (int *)0x0;
  }
  pnVar4 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).u.row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pnVar4 != *(pointer *)
                 ((long)&(this->
                         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).u.row.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data + 8)) {
    *(pointer *)
     ((long)&(this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).u.row.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data + 8) = pnVar4;
  }
  p = &(this->
       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).u.row.idx;
  piVar2 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).u.row.idx;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    *p = (int *)0x0;
  }
  p_00 = &(this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).u.col.idx;
  piVar2 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).u.col.idx;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    *p_00 = (int *)0x0;
  }
  p_01 = &(this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).l.idx;
  piVar2 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).l.idx;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    *p_01 = (int *)0x0;
  }
  p_02 = &(this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).l.start;
  piVar2 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).l.start;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    *p_02 = (int *)0x0;
  }
  p_03 = &(this->
          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).l.row;
  piVar2 = (this->
           super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).l.row;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    *p_03 = (int *)0x0;
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).u.row.val,
           (long)(this->
                 super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).u.row.size);
  spx_alloc<int*>(p,(this->
                    super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).u.row.size);
  spx_alloc<int*>(p_00,(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).u.col.size);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::resize(&(this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).l.val,(long)(this->
                          super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).l.size);
  spx_alloc<int*>(p_01,(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).l.size);
  spx_alloc<int*>(p_02,(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).l.startSize);
  spx_alloc<int*>(p_03,(this->
                       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).l.startSize);
  return;
}

Assistant:

void SLUFactor<R>::clear()
{

   this->rowMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   this->colMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   this->lMemMult      = 1;          /* factor of minimum Memory * #of nonzeros */

   this->l.firstUpdate = 0;
   this->l.firstUnused = 0;
   this->thedim        = 0;

   usetup        = false;
   this->maxabs        = 1;
   this->initMaxabs    = 1;
   lastThreshold = minThreshold;
   minStability  = SOPLEX_MINSTABILITY;
   this->stat          = this->UNLOADED;

   vec.clear();
   eta.clear();
   ssvec.clear();
   forest.clear();

   this->u.row.size    = 100;
   this->u.col.size    = 100;
   this->l.size        = 100;
   this->l.startSize   = 100;

   if(this->l.ridx)
      spx_free(this->l.ridx);

   if(this->l.rbeg)
      spx_free(this->l.rbeg);

   if(this->l.rorig)
      spx_free(this->l.rorig);

   if(this->l.rperm)
      spx_free(this->l.rperm);

   if(!this->u.row.val.empty())
      this->u.row.val.clear();

   if(this->u.row.idx)
      spx_free(this->u.row.idx);

   if(this->u.col.idx)
      spx_free(this->u.col.idx);

   if(this->l.val.empty())
      this->l.val.clear();

   if(this->l.idx)
      spx_free(this->l.idx);

   if(this->l.start)
      spx_free(this->l.start);

   if(this->l.row)
      spx_free(this->l.row);

   // G clear() is used in constructor of SLUFactor<R> so we have to
   // G clean up if anything goes wrong here
   try
   {
      this->u.row.val.resize(this->u.row.size);
      spx_alloc(this->u.row.idx, this->u.row.size);
      spx_alloc(this->u.col.idx, this->u.col.size);

      this->l.val.resize(this->l.size);
      spx_alloc(this->l.idx,   this->l.size);
      spx_alloc(this->l.start, this->l.startSize);
      spx_alloc(this->l.row,   this->l.startSize);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }
}